

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImDrawList * __thiscall ImDrawList::CloneOutput(ImDrawList *this)

{
  ImVector<ImDrawCmd> *this_00;
  ImDrawList *pIVar1;
  ImDrawListSharedData *in_RDI;
  ImDrawList *unaff_retaddr;
  ImDrawList *dst;
  ImVector<ImDrawCmd> *src;
  size_t in_stack_ffffffffffffffc0;
  ImDrawListSharedData *shared_data;
  
  src = (ImVector<ImDrawCmd> *)0xc8;
  shared_data = in_RDI;
  this_00 = (ImVector<ImDrawCmd> *)ImGui::MemAlloc(in_stack_ffffffffffffffc0);
  pIVar1 = (ImDrawList *)::operator_new(src);
  ImDrawList(unaff_retaddr,shared_data);
  ImVector<ImDrawCmd>::operator=(this_00,src);
  ImVector<unsigned_short>::operator=
            ((ImVector<unsigned_short> *)this_00,(ImVector<unsigned_short> *)src);
  ImVector<ImDrawVert>::operator=((ImVector<ImDrawVert> *)this_00,(ImVector<ImDrawVert> *)src);
  pIVar1->Flags = (in_RDI->TempBuffer).Size;
  return pIVar1;
}

Assistant:

ImDrawList* ImDrawList::CloneOutput() const
{
    ImDrawList* dst = IM_NEW(ImDrawList(_Data));
    dst->CmdBuffer = CmdBuffer;
    dst->IdxBuffer = IdxBuffer;
    dst->VtxBuffer = VtxBuffer;
    dst->Flags = Flags;
    return dst;
}